

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O2

void av1_cdef_init_fb_row
               (AV1_COMMON *cm,MACROBLOCKD *xd,CdefBlockInfo *fb_info,uint16_t **linebuf,
               uint16_t *src,AV1CdefSyncData *cdef_sync,int fbr)

{
  uint8_t uVar1;
  int iVar2;
  SequenceHeader *pSVar3;
  uint16_t *puVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int dstride;
  int *piVar11;
  
  pSVar3 = cm->seq_params;
  uVar1 = pSVar3->monochrome;
  iVar5 = (cm->mi_params).mi_rows;
  iVar2 = (cm->mi_params).mi_cols;
  fb_info->frame_boundary[0] = (uint)(fbr == 0);
  iVar5 = (iVar5 + 0xf) / 0x10 + -1;
  iVar8 = fbr * 0x10 + 0x10;
  if (iVar5 == fbr) {
    uVar6 = 1;
  }
  else {
    uVar6 = (uint)(iVar8 == (cm->mi_params).mi_rows);
  }
  fb_info->frame_boundary[2] = uVar6;
  fb_info->src = src;
  fb_info->damping = (cm->cdef_info).cdef_damping;
  fb_info->coeff_shift = pSVar3->bit_depth - AOM_BITS_8;
  uVar6 = fbr * 2 & 2;
  uVar7 = uVar6 ^ 2;
  memset(fb_info->dir,0,0x800);
  piVar11 = &xd->plane[0].dst.stride;
  for (lVar9 = 0; (ulong)(uVar1 == '\0') * 2 + 1 != lVar9; lVar9 = lVar9 + 1) {
    dstride = (int)(iVar2 * 4 + 0xfU & 0xfffffff0) >> (*(byte *)(piVar11 + -9) & 0x1f);
    iVar10 = piVar11[-8];
    puVar4 = linebuf[lVar9];
    fb_info->bot_linebuf[lVar9] = puVar4 + dstride * 4;
    if (iVar5 == fbr) {
      fb_info->top_linebuf[lVar9] = linebuf[lVar9] + (int)(dstride * uVar7);
    }
    else {
      iVar10 = iVar8 << (2U - (char)iVar10 & 0x1f);
      av1_cdef_copy_sb8_16
                (cm,puVar4 + (int)(dstride * uVar6),dstride,((buf_2d *)(piVar11 + -6))->buf,
                 iVar10 + -2,0,*piVar11,2,dstride);
      fb_info->top_linebuf[lVar9] = linebuf[lVar9] + (int)(dstride * uVar7);
      av1_cdef_copy_sb8_16
                (cm,fb_info->bot_linebuf[lVar9],dstride,((buf_2d *)(piVar11 + -6))->buf,iVar10,0,
                 *piVar11,2,dstride);
    }
    piVar11 = piVar11 + 0x28c;
  }
  return;
}

Assistant:

void av1_cdef_init_fb_row(const AV1_COMMON *const cm,
                          const MACROBLOCKD *const xd,
                          CdefBlockInfo *const fb_info,
                          uint16_t **const linebuf, uint16_t *const src,
                          struct AV1CdefSyncData *const cdef_sync, int fbr) {
  (void)cdef_sync;
  const int num_planes = av1_num_planes(cm);
  const int nvfb = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int luma_stride =
      ALIGN_POWER_OF_TWO(cm->mi_params.mi_cols << MI_SIZE_LOG2, 4);
  const bool ping_pong = fbr & 1;
  // for the current filter block, it's top left corner mi structure (mi_tl)
  // is first accessed to check whether the top and left boundaries are
  // frame boundaries. Then bottom-left and top-right mi structures are
  // accessed to check whether the bottom and right boundaries
  // (respectively) are frame boundaries.
  //
  // Note that we can't just check the bottom-right mi structure - eg. if
  // we're at the right-hand edge of the frame but not the bottom, then
  // the bottom-right mi is NULL but the bottom-left is not.
  fb_info->frame_boundary[TOP] = (MI_SIZE_64X64 * fbr == 0) ? 1 : 0;
  if (fbr != nvfb - 1)
    fb_info->frame_boundary[BOTTOM] =
        (MI_SIZE_64X64 * (fbr + 1) == cm->mi_params.mi_rows) ? 1 : 0;
  else
    fb_info->frame_boundary[BOTTOM] = 1;

  fb_info->src = src;
  fb_info->damping = cm->cdef_info.cdef_damping;
  fb_info->coeff_shift = AOMMAX(cm->seq_params->bit_depth - 8, 0);
  av1_zero(fb_info->dir);
  av1_zero(fb_info->var);

  for (int plane = 0; plane < num_planes; plane++) {
    const int mi_high_l2 = MI_SIZE_LOG2 - xd->plane[plane].subsampling_y;
    const int offset = MI_SIZE_64X64 * (fbr + 1) << mi_high_l2;
    const int stride = luma_stride >> xd->plane[plane].subsampling_x;
    // here ping-pong buffers are maintained for top linebuf
    // to avoid linebuf over-write by consecutive row.
    uint16_t *const top_linebuf =
        &linebuf[plane][ping_pong * CDEF_VBORDER * stride];
    fb_info->bot_linebuf[plane] = &linebuf[plane][(CDEF_VBORDER << 1) * stride];

    if (fbr != nvfb - 1)  // top line buffer copy
      av1_cdef_copy_sb8_16(cm, top_linebuf, stride, xd->plane[plane].dst.buf,
                           offset - CDEF_VBORDER, 0,
                           xd->plane[plane].dst.stride, CDEF_VBORDER, stride);
    fb_info->top_linebuf[plane] =
        &linebuf[plane][(!ping_pong) * CDEF_VBORDER * stride];

    if (fbr != nvfb - 1)  // bottom line buffer copy
      av1_cdef_copy_sb8_16(cm, fb_info->bot_linebuf[plane], stride,
                           xd->plane[plane].dst.buf, offset, 0,
                           xd->plane[plane].dst.stride, CDEF_VBORDER, stride);
  }
}